

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O0

lineiter_t * lineiter_next(lineiter_t *li)

{
  char *pcVar1;
  lineiter_t *local_18;
  lineiter_t *li_local;
  
  if (li->clean == 0) {
    li_local = lineiter_next_plain(li);
  }
  else {
    for (local_18 = lineiter_next_plain(li); local_18 != (lineiter_t *)0x0;
        local_18 = lineiter_next_plain(local_18)) {
      if (local_18->buf != (char *)0x0) {
        pcVar1 = string_trim(local_18->buf,STRING_BOTH);
        local_18->buf = pcVar1;
        if ((*local_18->buf != '\0') && (*local_18->buf != '#')) break;
      }
    }
    li_local = local_18;
  }
  return li_local;
}

Assistant:

lineiter_t *
lineiter_next(lineiter_t *li)
{
    if (!li->clean)
	return lineiter_next_plain(li);
    
    for (li = lineiter_next_plain(li); li; li = lineiter_next_plain(li)) {
	if (li->buf) {
	    li->buf = string_trim(li->buf, STRING_BOTH);
	    if (li->buf[0] != 0 && li->buf[0] != '#')
		break;
	}
    }
    return li;
}